

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int __thiscall
ON_String::Compare(ON_String *this,ON_String *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  int iVar1;
  char *string1;
  char *string2;
  
  string1 = operator_cast_to_char_(this);
  Length(this);
  string2 = operator_cast_to_char_(other_string);
  Length(other_string);
  iVar1 = ON_StringCompareOrdinalUTF8(string1,-1,string2,-1,bIgnoreCase);
  return iVar1;
}

Assistant:

int ON_String::Compare(
  const ON_String& other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_String::Compare(
    static_cast< const char* >(*this),
    this->Length(),
    static_cast< const char* >(other_string),
    other_string.Length(),
    locale,
    bIgnoreCase
    );
}